

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O1

bool __thiscall branch_and_reduce_algorithm::dinicDFS(branch_and_reduce_algorithm *this,int v)

{
  uint uVar1;
  int iVar2;
  pointer piVar3;
  pointer pvVar4;
  pointer piVar5;
  bool bVar6;
  bool bVar7;
  
  piVar3 = (this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = piVar3[v];
  do {
    bVar6 = -1 < (int)uVar1;
    if (!bVar6) {
      return bVar6;
    }
    pvVar4 = (this->adj).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar3[v] = uVar1 - 1;
    iVar2 = *(int *)(*(long *)&pvVar4[v].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data + (ulong)uVar1 * 4);
    if ((this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar2] < 0) {
      uVar1 = (this->in).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar2];
      if (((int)uVar1 < 0) ||
         (((piVar5 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start, piVar5[v] < piVar5[uVar1] &&
           (-1 < piVar3[uVar1])) && (bVar7 = dinicDFS(this,uVar1), bVar7)))) {
        (this->in).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar2] = v;
        (this->out).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[v] = iVar2;
        return bVar6;
      }
    }
    piVar3 = (this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar1 = piVar3[v];
  } while( true );
}

Assistant:

bool branch_and_reduce_algorithm::dinicDFS(int v)
{
    while (iter[v] >= 0)
    {
        int u = adj[v][iter[v]--], w = in[u];
        if (x[u] >= 0)
            continue;
        if (w < 0 || (level[v] < level[w] && iter[w] >= 0 && dinicDFS(w)))
        {
            in[u] = v;
            out[v] = u;
            return true;
        }
    }
    return false;
}